

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::
     q_relocate_overlap_n_left_move<std::reverse_iterator<QWindowSystemInterface::TouchPoint*>,long_long>
               (reverse_iterator<QWindowSystemInterface::TouchPoint_*> first,longlong n,
               reverse_iterator<QWindowSystemInterface::TouchPoint_*> d_first)

{
  TouchPoint *pTVar1;
  long lVar2;
  Data *pDVar3;
  QPointF *pQVar4;
  qsizetype qVar5;
  reverse_iterator<QWindowSystemInterface::TouchPoint_*> *prVar6;
  long lVar7;
  undefined8 *puVar8;
  TouchPoint *pTVar9;
  TouchPoint *pTVar10;
  TouchPoint *pTVar11;
  TouchPoint *pTVar12;
  long in_FS_OFFSET;
  byte bVar13;
  Destructor local_48;
  long local_30;
  
  bVar13 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.iter = &local_48.intermediate;
  local_48.end.current = *d_first.current;
  pTVar11 = local_48.end.current + -n;
  pTVar1 = *first.current;
  pTVar12 = pTVar1;
  pTVar10 = pTVar11;
  if (pTVar11 < pTVar1) {
    pTVar12 = pTVar11;
    pTVar10 = pTVar1;
  }
  pTVar1 = *d_first.current;
  while (pTVar1 != pTVar10) {
    lVar2 = *(long *)first.current;
    puVar8 = (undefined8 *)(lVar2 + -0x78);
    pTVar9 = pTVar1 + -1;
    for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
      *(undefined8 *)pTVar9 = *puVar8;
      puVar8 = puVar8 + 1;
      pTVar9 = (TouchPoint *)&pTVar9->uniqueId;
    }
    pTVar1[-1].velocity.v[1] = *(float *)(lVar2 + -0x20);
    pDVar3 = *(Data **)(lVar2 + -0x18);
    *(undefined8 *)(lVar2 + -0x18) = 0;
    pTVar1[-1].rawPositions.d.d = pDVar3;
    pQVar4 = *(QPointF **)(lVar2 + -0x10);
    *(undefined8 *)(lVar2 + -0x10) = 0;
    pTVar1[-1].rawPositions.d.ptr = pQVar4;
    qVar5 = *(qsizetype *)(lVar2 + -8);
    *(undefined8 *)(lVar2 + -8) = 0;
    pTVar1[-1].rawPositions.d.size = qVar5;
    *(long *)d_first.current = *(long *)d_first.current + -0x78;
    *(long *)first.current = *(long *)first.current + -0x78;
    pTVar1 = *d_first.current;
  }
  local_48.intermediate.current = *d_first.current;
  while (pTVar1 = *d_first.current, prVar6 = &local_48.end, pTVar1 != pTVar11) {
    lVar2 = *(long *)first.current;
    puVar8 = (undefined8 *)(lVar2 + -0x78);
    pTVar10 = pTVar1 + -1;
    for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
      *(undefined8 *)pTVar10 = *puVar8;
      puVar8 = puVar8 + (ulong)bVar13 * -2 + 1;
      pTVar10 = (TouchPoint *)((long)pTVar10 + ((ulong)bVar13 * -2 + 1) * 8);
    }
    pTVar1[-1].velocity.v[1] = *(float *)(lVar2 + -0x20);
    QArrayDataPointer<QPointF>::operator=
              (&pTVar1[-1].rawPositions.d,(QArrayDataPointer<QPointF> *)(lVar2 + -0x18));
    *(long *)d_first.current = *(long *)d_first.current + -0x78;
    *(long *)first.current = *(long *)first.current + -0x78;
  }
  while (local_48.iter = prVar6, pTVar1 = *first.current, pTVar1 != pTVar12) {
    *(TouchPoint **)first.current = pTVar1 + 1;
    pDVar3 = (pTVar1->rawPositions).d.d;
    prVar6 = local_48.iter;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&((pTVar1->rawPositions).d.d)->super_QArrayData,0x10,0x10);
        prVar6 = local_48.iter;
      }
    }
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QWindowSystemInterface::TouchPoint_*>,_long_long>
  ::Destructor::~Destructor(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}